

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rsgBinaryOps.cpp
# Opt level: O3

void __thiscall
rsg::RelationalOp<rsg::ComputeGreaterThanRange,_rsg::EvaluateGreaterThan>::RelationalOp
          (RelationalOp<rsg::ComputeGreaterThanRange,_rsg::EvaluateGreaterThan> *this,
          GeneratorState *state,Type operatorToken,ConstValueRangeAccess inValueRange)

{
  VariableType *this_00;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  ValueRangeAccess valueRange_00;
  Type TVar2;
  int iVar3;
  pointer bMin;
  pointer bMax;
  pointer pSVar4;
  pointer aMin;
  pointer aMax;
  Type inBaseTypes [2];
  Type val;
  ValueRange valueRange;
  Type local_198 [2];
  ValueRange *local_190;
  Scalar *pSStack_188;
  Scalar *local_180;
  ValueRange local_178;
  VariableType local_f8;
  ValueRange local_a8;
  
  BinaryOp<7,_(rsg::Associativity)0>::BinaryOp
            (&this->super_BinaryOp<7,_(rsg::Associativity)0>,operatorToken);
  (this->super_BinaryOp<7,_(rsg::Associativity)0>).super_Expression._vptr_Expression =
       (_func_int **)&PTR__BinaryOp_007881d8;
  ValueRange::ValueRange(&local_a8,inValueRange);
  paVar1 = &local_f8.m_typeName.field_2;
  if (local_a8.m_type.m_baseType == TYPE_VOID) {
    local_f8.m_baseType = TYPE_BOOL;
    local_f8.m_precision = PRECISION_NONE;
    local_f8.m_typeName._M_string_length = 0;
    local_f8.m_typeName.field_2._M_local_buf[0] = '\0';
    local_f8.m_numElements = 1;
    local_f8.m_elementType = (VariableType *)0x0;
    local_f8.m_members.
    super__Vector_base<rsg::VariableType::Member,_std::allocator<rsg::VariableType::Member>_>.
    _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_f8.m_members.
    super__Vector_base<rsg::VariableType::Member,_std::allocator<rsg::VariableType::Member>_>.
    _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_f8.m_members.
    super__Vector_base<rsg::VariableType::Member,_std::allocator<rsg::VariableType::Member>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_f8.m_typeName._M_dataplus._M_p = (pointer)paVar1;
    ValueRange::ValueRange(&local_178,&local_f8);
    VariableType::operator=(&local_a8.m_type,&local_178.m_type);
    std::vector<rsg::Scalar,_std::allocator<rsg::Scalar>_>::operator=
              (&local_a8.m_min,&local_178.m_min);
    std::vector<rsg::Scalar,_std::allocator<rsg::Scalar>_>::operator=
              (&local_a8.m_max,&local_178.m_max);
    ValueRange::~ValueRange(&local_178);
    VariableType::~VariableType(&local_f8);
    pSStack_188 = local_a8.m_min.super__Vector_base<rsg::Scalar,_std::allocator<rsg::Scalar>_>.
                  _M_impl.super__Vector_impl_data._M_start;
    if (local_a8.m_min.super__Vector_base<rsg::Scalar,_std::allocator<rsg::Scalar>_>._M_impl.
        super__Vector_impl_data._M_start ==
        local_a8.m_min.super__Vector_base<rsg::Scalar,_std::allocator<rsg::Scalar>_>._M_impl.
        super__Vector_impl_data._M_finish) {
      pSStack_188 = (Scalar *)0x0;
    }
    local_180 = local_a8.m_max.super__Vector_base<rsg::Scalar,_std::allocator<rsg::Scalar>_>._M_impl
                .super__Vector_impl_data._M_start;
    if (local_a8.m_max.super__Vector_base<rsg::Scalar,_std::allocator<rsg::Scalar>_>._M_impl.
        super__Vector_impl_data._M_start ==
        local_a8.m_max.super__Vector_base<rsg::Scalar,_std::allocator<rsg::Scalar>_>._M_impl.
        super__Vector_impl_data._M_finish) {
      local_180 = (Scalar *)0x0;
    }
    valueRange_00.super_ConstValueRangeAccess.m_min = pSStack_188;
    valueRange_00.super_ConstValueRangeAccess.m_type = &local_a8.m_type;
    valueRange_00.super_ConstValueRangeAccess.m_max = local_180;
    local_190 = &local_a8;
    computeRandomValueRange(state,valueRange_00);
  }
  this_00 = &(this->super_BinaryOp<7,_(rsg::Associativity)0>).m_type;
  VariableType::operator=(this_00,&local_a8.m_type);
  iVar3 = VariableType::getScalarSize(this_00);
  std::vector<rsg::Scalar,_std::allocator<rsg::Scalar>_>::resize
            (&(this->super_BinaryOp<7,_(rsg::Associativity)0>).m_value.m_value,(long)(iVar3 << 6));
  local_198[0] = TYPE_FLOAT;
  local_198[1] = TYPE_INT;
  local_178.m_type.m_baseType = TYPE_VOID;
  de::Random::choose<rsg::VariableType::Type*,rsg::VariableType::Type*>
            (state->m_random,local_198,(Type *)&local_190,(Type *)&local_178,1);
  TVar2 = local_178.m_type.m_baseType;
  local_f8.m_precision = PRECISION_NONE;
  local_f8.m_baseType = local_178.m_type.m_baseType;
  local_f8.m_typeName._M_string_length = 0;
  local_f8.m_typeName.field_2._M_local_buf[0] = '\0';
  local_f8.m_numElements = 1;
  local_f8.m_elementType = (VariableType *)0x0;
  local_f8.m_members.
  super__Vector_base<rsg::VariableType::Member,_std::allocator<rsg::VariableType::Member>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_f8.m_members.
  super__Vector_base<rsg::VariableType::Member,_std::allocator<rsg::VariableType::Member>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_f8.m_members.
  super__Vector_base<rsg::VariableType::Member,_std::allocator<rsg::VariableType::Member>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_f8.m_typeName._M_dataplus._M_p = (pointer)paVar1;
  ValueRange::ValueRange(&local_178,&local_f8);
  VariableType::operator=
            (&(this->super_BinaryOp<7,_(rsg::Associativity)0>).m_rightValueRange.m_type,
             &local_178.m_type);
  std::vector<rsg::Scalar,_std::allocator<rsg::Scalar>_>::operator=
            (&(this->super_BinaryOp<7,_(rsg::Associativity)0>).m_rightValueRange.m_min,
             &local_178.m_min);
  std::vector<rsg::Scalar,_std::allocator<rsg::Scalar>_>::operator=
            (&(this->super_BinaryOp<7,_(rsg::Associativity)0>).m_rightValueRange.m_max,
             &local_178.m_max);
  ValueRange::~ValueRange(&local_178);
  VariableType::~VariableType(&local_f8);
  local_f8.m_precision = PRECISION_NONE;
  local_f8.m_baseType = TVar2;
  local_f8.m_typeName._M_string_length = 0;
  local_f8.m_typeName.field_2._M_local_buf[0] = '\0';
  local_f8.m_numElements = 1;
  local_f8.m_elementType = (VariableType *)0x0;
  local_f8.m_members.
  super__Vector_base<rsg::VariableType::Member,_std::allocator<rsg::VariableType::Member>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_f8.m_members.
  super__Vector_base<rsg::VariableType::Member,_std::allocator<rsg::VariableType::Member>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_f8.m_members.
  super__Vector_base<rsg::VariableType::Member,_std::allocator<rsg::VariableType::Member>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_f8.m_typeName._M_dataplus._M_p = (pointer)paVar1;
  ValueRange::ValueRange(&local_178,&local_f8);
  VariableType::operator=
            (&(this->super_BinaryOp<7,_(rsg::Associativity)0>).m_leftValueRange.m_type,
             &local_178.m_type);
  std::vector<rsg::Scalar,_std::allocator<rsg::Scalar>_>::operator=
            (&(this->super_BinaryOp<7,_(rsg::Associativity)0>).m_leftValueRange.m_min,
             &local_178.m_min);
  std::vector<rsg::Scalar,_std::allocator<rsg::Scalar>_>::operator=
            (&(this->super_BinaryOp<7,_(rsg::Associativity)0>).m_leftValueRange.m_max,
             &local_178.m_max);
  ValueRange::~ValueRange(&local_178);
  VariableType::~VariableType(&local_f8);
  bMin = (this->super_BinaryOp<7,_(rsg::Associativity)0>).m_leftValueRange.m_min.
         super__Vector_base<rsg::Scalar,_std::allocator<rsg::Scalar>_>._M_impl.
         super__Vector_impl_data._M_start;
  bMax = (this->super_BinaryOp<7,_(rsg::Associativity)0>).m_leftValueRange.m_max.
         super__Vector_base<rsg::Scalar,_std::allocator<rsg::Scalar>_>._M_impl.
         super__Vector_impl_data._M_start;
  pSVar4 = (pointer)0x0;
  if (bMin == (this->super_BinaryOp<7,_(rsg::Associativity)0>).m_leftValueRange.m_min.
              super__Vector_base<rsg::Scalar,_std::allocator<rsg::Scalar>_>._M_impl.
              super__Vector_impl_data._M_finish) {
    bMin = pSVar4;
  }
  if (bMax == (this->super_BinaryOp<7,_(rsg::Associativity)0>).m_leftValueRange.m_max.
              super__Vector_base<rsg::Scalar,_std::allocator<rsg::Scalar>_>._M_impl.
              super__Vector_impl_data._M_finish) {
    bMax = pSVar4;
  }
  aMin = (this->super_BinaryOp<7,_(rsg::Associativity)0>).m_rightValueRange.m_min.
         super__Vector_base<rsg::Scalar,_std::allocator<rsg::Scalar>_>._M_impl.
         super__Vector_impl_data._M_start;
  if (aMin == (this->super_BinaryOp<7,_(rsg::Associativity)0>).m_rightValueRange.m_min.
              super__Vector_base<rsg::Scalar,_std::allocator<rsg::Scalar>_>._M_impl.
              super__Vector_impl_data._M_finish) {
    aMin = pSVar4;
  }
  aMax = (this->super_BinaryOp<7,_(rsg::Associativity)0>).m_rightValueRange.m_max.
         super__Vector_base<rsg::Scalar,_std::allocator<rsg::Scalar>_>._M_impl.
         super__Vector_impl_data._M_start;
  if (aMax == (this->super_BinaryOp<7,_(rsg::Associativity)0>).m_rightValueRange.m_max.
              super__Vector_base<rsg::Scalar,_std::allocator<rsg::Scalar>_>._M_impl.
              super__Vector_impl_data._M_finish) {
    aMax = pSVar4;
  }
  if (TVar2 == TYPE_INT) {
    ComputeLessThanRange::operator()
              ((ComputeLessThanRange *)&local_178,state->m_random,
               (local_a8.m_min.super__Vector_base<rsg::Scalar,_std::allocator<rsg::Scalar>_>._M_impl
                .super__Vector_impl_data._M_start)->boolVal,
               (local_a8.m_max.super__Vector_base<rsg::Scalar,_std::allocator<rsg::Scalar>_>._M_impl
                .super__Vector_impl_data._M_start)->boolVal,&aMin->intVal,&aMax->intVal,
               &bMin->intVal,&bMax->intVal);
  }
  else if (TVar2 == TYPE_FLOAT) {
    ComputeLessThanRange::operator()
              ((ComputeLessThanRange *)&local_178,state->m_random,
               (local_a8.m_min.super__Vector_base<rsg::Scalar,_std::allocator<rsg::Scalar>_>._M_impl
                .super__Vector_impl_data._M_start)->boolVal,
               (local_a8.m_max.super__Vector_base<rsg::Scalar,_std::allocator<rsg::Scalar>_>._M_impl
                .super__Vector_impl_data._M_start)->boolVal,&aMin->floatVal,&aMax->floatVal,
               &bMin->floatVal,&bMax->floatVal);
  }
  ValueRange::~ValueRange(&local_a8);
  return;
}

Assistant:

RelationalOp<ComputeValueRange, EvaluateComp>::RelationalOp (GeneratorState& state, Token::Type operatorToken, ConstValueRangeAccess inValueRange)
	: BinaryOp<7, ASSOCIATIVITY_LEFT>(operatorToken)
{
	ValueRange valueRange = inValueRange;

	if (valueRange.getType().isVoid())
	{
		valueRange = ValueRange(VariableType(VariableType::TYPE_BOOL, 1));
		computeRandomValueRange(state, valueRange.asAccess());
	}

	// Choose type, allocate storage for execution
	this->m_type = valueRange.getType();
	this->m_value.setStorage(this->m_type);

	// Choose random input type
	VariableType::Type inBaseTypes[]	= { VariableType::TYPE_FLOAT, VariableType::TYPE_INT };
	VariableType::Type inBaseType		= state.getRandom().choose<VariableType::Type>(&inBaseTypes[0], &inBaseTypes[DE_LENGTH_OF_ARRAY(inBaseTypes)]);

	// Initialize storage for input value ranges
	this->m_rightValueRange	= ValueRange(VariableType(inBaseType, 1));
	this->m_leftValueRange	= ValueRange(VariableType(inBaseType, 1));

	// Compute range for b that satisfies requested value range
	{
		bool					dstMin	= valueRange.getMin().asBool();
		bool					dstMax	= valueRange.getMax().asBool();
		ValueRangeAccess		a		= this->m_leftValueRange.asAccess();
		ValueRangeAccess		b		= this->m_rightValueRange.asAccess();

		if (inBaseType == VariableType::TYPE_FLOAT)
			ComputeValueRange()(state.getRandom(), dstMin, dstMax,
								a.getMin().asFloat(), a.getMax().asFloat(),
								b.getMin().asFloat(), b.getMax().asFloat());
		else if (inBaseType == VariableType::TYPE_INT)
			ComputeValueRange()(state.getRandom(), dstMin, dstMax,
								a.getMin().asInt(), a.getMax().asInt(),
								b.getMin().asInt(), b.getMax().asInt());
	}
}